

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool CanonicalizePath(string *path,uint64_t *slash_bits,string *err)

{
  Metrics *this;
  int iVar1;
  Metric *local_a8;
  char *local_80;
  char *str;
  size_t len;
  ScopedMetric metrics_h_scoped;
  bool local_4a;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  uint64_t *slash_bits_local;
  string *path_local;
  
  local_28 = err;
  err_local = (string *)slash_bits;
  slash_bits_local = (uint64_t *)path;
  if ((CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)::
       metrics_h_metric == '\0') &&
     (iVar1 = __cxa_guard_acquire(&CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)
                                   ::metrics_h_metric), this = g_metrics, iVar1 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_4a = g_metrics == (Metrics *)0x0;
    if (local_4a) {
      local_a8 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"canonicalize str",&local_49);
      metrics_h_scoped.start_._3_1_ = 1;
      local_a8 = Metrics::NewMetric(this,&local_48);
    }
    local_4a = !local_4a;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (local_4a) {
      std::allocator<char>::~allocator(&local_49);
    }
    CanonicalizePath::metrics_h_metric = local_a8;
    __cxa_guard_release(&CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&len,CanonicalizePath::metrics_h_metric);
  str = (char *)std::__cxx11::string::size();
  local_80 = (char *)0x0;
  if (str != (char *)0x0) {
    local_80 = (char *)std::__cxx11::string::operator[]((ulong)slash_bits_local);
  }
  path_local._7_1_ = CanonicalizePath(local_80,(size_t *)&str,(uint64_t *)err_local,local_28);
  if ((bool)path_local._7_1_) {
    std::__cxx11::string::resize((ulong)slash_bits_local);
  }
  ScopedMetric::~ScopedMetric((ScopedMetric *)&len);
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool CanonicalizePath(string* path, uint64_t* slash_bits, string* err) {
  METRIC_RECORD("canonicalize str");
  size_t len = path->size();
  char* str = 0;
  if (len > 0)
    str = &(*path)[0];
  if (!CanonicalizePath(str, &len, slash_bits, err))
    return false;
  path->resize(len);
  return true;
}